

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledRgba.cpp
# Opt level: O0

void anon_unknown.dwarf_24c551::writeReadLayers(string *tempDir)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ostream *this;
  half *phVar4;
  char *pcVar5;
  Rgba *pRVar6;
  float fVar7;
  float fVar8;
  int x_6;
  int y_6;
  Array2D<Imf_3_4::Rgba> p3_5;
  TiledRgbaInputFile in_5;
  int x_5;
  int y_5;
  Array2D<Imf_3_4::Rgba> p3_4;
  TiledRgbaInputFile in_4;
  int x_4;
  int y_4;
  Array2D<Imf_3_4::Rgba> p3_3;
  TiledRgbaInputFile in_3;
  TiledOutputFile out_1;
  FrameBuffer fb_1;
  Header hdr_1;
  int x_3;
  int y_3;
  Array2D<Imf_3_4::Rgba> p3_2;
  TiledRgbaInputFile in_2;
  int x_2;
  int y_2;
  Array2D<Imf_3_4::Rgba> p3_1;
  TiledRgbaInputFile in_1;
  int x_1;
  int y_1;
  Array2D<Imf_3_4::Rgba> p3;
  TiledRgbaInputFile in;
  TiledOutputFile out;
  FrameBuffer fb;
  Header hdr;
  int x;
  int y;
  Array2D<Imath_3_2::half> p2;
  Array2D<Imath_3_2::half> p1;
  int H;
  int W;
  string fileName;
  float in_stack_fffffffffffff6fc;
  undefined4 in_stack_fffffffffffff700;
  undefined4 uVar9;
  undefined4 in_stack_fffffffffffff704;
  undefined4 in_stack_fffffffffffff708;
  undefined4 in_stack_fffffffffffff70c;
  undefined4 in_stack_fffffffffffff710;
  undefined4 in_stack_fffffffffffff714;
  undefined4 in_stack_fffffffffffff720;
  undefined4 in_stack_fffffffffffff724;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff728;
  undefined4 in_stack_fffffffffffff730;
  undefined4 in_stack_fffffffffffff734;
  char *in_stack_fffffffffffff738;
  undefined4 in_stack_fffffffffffff740;
  undefined4 in_stack_fffffffffffff744;
  long in_stack_fffffffffffff748;
  undefined4 in_stack_fffffffffffff750;
  undefined4 in_stack_fffffffffffff754;
  int local_62c;
  int local_628;
  allocator<char> local_621;
  string local_620 [32];
  Array2D<Imf_3_4::Rgba> local_600;
  allocator<char> local_5e1;
  string local_5e0 [32];
  Rgba local_5c0 [7];
  int local_588;
  int local_584;
  Array2D<Imf_3_4::Rgba> local_580;
  allocator<char> local_561;
  string local_560 [32];
  Rgba local_540 [7];
  int local_508;
  int local_504;
  Array2D<Imf_3_4::Rgba> local_500;
  allocator<char> local_4e1;
  string local_4e0 [32];
  Rgba local_4c0 [7];
  undefined1 local_488 [88];
  Slice local_430 [56];
  char local_3f8 [48];
  Channel local_3c8 [16];
  Channel local_3b8 [16];
  TileDescription local_3a8;
  Vec2<float> local_398;
  TileDescription local_390 [3];
  int local_354;
  int local_350;
  allocator<char> local_349;
  string local_348 [32];
  Array2D<Imf_3_4::Rgba> local_328;
  allocator<char> local_309;
  string local_308 [32];
  Rgba local_2e8 [7];
  int local_2b0;
  int local_2ac;
  Array2D<Imf_3_4::Rgba> local_2a8;
  allocator<char> local_289;
  string local_288 [32];
  Rgba local_268 [7];
  int local_230;
  int local_22c;
  Array2D<Imf_3_4::Rgba> local_228;
  allocator<char> local_209;
  string local_208 [32];
  Rgba local_1e8 [7];
  undefined1 local_1b0 [88];
  Slice local_158 [56];
  char local_120 [48];
  Channel local_f0 [16];
  Channel local_e0 [16];
  TileDescription local_d0;
  Vec2<float> local_c0;
  TileDescription local_b8 [3];
  uint16_t local_7c;
  uint16_t local_7a;
  int local_78;
  int local_74;
  Array2D<Imath_3_2::half> local_70;
  Array2D<Imath_3_2::half> local_48;
  undefined4 local_30;
  undefined4 local_2c;
  string local_28 [40];
  
  this = std::operator<<((ostream *)&std::cout,"\nreading multi-layer file");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::operator+(in_stack_fffffffffffff728,
                 (char *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720));
  local_2c = 0xed;
  local_30 = 0x77;
  Imf_3_4::Array2D<Imath_3_2::half>::Array2D
            ((Array2D<Imath_3_2::half> *)
             CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
             CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708),
             CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700));
  Imf_3_4::Array2D<Imath_3_2::half>::Array2D
            ((Array2D<Imath_3_2::half> *)
             CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
             CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708),
             CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700));
  for (local_74 = 0; local_74 < 0x77; local_74 = local_74 + 1) {
    for (local_78 = 0; local_78 < 0xed; local_78 = local_78 + 1) {
      Imath_3_2::half::half
                ((half *)CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700),
                 in_stack_fffffffffffff6fc);
      phVar4 = Imf_3_4::Array2D<Imath_3_2::half>::operator[](&local_48,(long)local_74);
      phVar4[local_78]._h = local_7a;
      Imath_3_2::half::half
                ((half *)CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700),
                 in_stack_fffffffffffff6fc);
      phVar4 = Imf_3_4::Array2D<Imath_3_2::half>::operator[](&local_70,(long)local_74);
      phVar4[local_78]._h = local_7c;
    }
  }
  Imath_3_2::Vec2<float>::Vec2(&local_c0,0.0,0.0);
  Imf_3_4::Header::Header
            ((Header *)local_b8,0xed,0x77,1.0,(Vec2 *)&local_c0,1.0,INCREASING_Y,ZIP_COMPRESSION);
  Imf_3_4::TileDescription::TileDescription(&local_d0,0x20,0x20,ONE_LEVEL,ROUND_DOWN);
  Imf_3_4::Header::setTileDescription(local_b8);
  pcVar5 = (char *)Imf_3_4::Header::channels();
  Imf_3_4::Channel::Channel(local_e0,HALF,1,1,false);
  Imf_3_4::ChannelList::insert(pcVar5,(Channel *)0x225753);
  pcVar5 = (char *)Imf_3_4::Header::channels();
  Imf_3_4::Channel::Channel(local_f0,HALF,1,1,false);
  Imf_3_4::ChannelList::insert(pcVar5,(Channel *)"foo.R");
  Imf_3_4::FrameBuffer::FrameBuffer((FrameBuffer *)0x216b4e);
  phVar4 = Imf_3_4::Array2D<Imath_3_2::half>::operator[](&local_48,0);
  Imf_3_4::Slice::Slice(local_158,HALF,(char *)phVar4,2,0x1da,1,1,0.0,false,false);
  Imf_3_4::FrameBuffer::insert(local_120,(Slice *)0x225753);
  phVar4 = Imf_3_4::Array2D<Imath_3_2::half>::operator[](&local_70,0);
  uVar9 = 0;
  Imf_3_4::Slice::Slice((Slice *)(local_1b0 + 0x20),HALF,(char *)phVar4,2,0x1da,1,1,0.0,false,false)
  ;
  Imf_3_4::FrameBuffer::insert(local_120,(Slice *)"foo.R");
  pcVar5 = (char *)std::__cxx11::string::c_str();
  iVar1 = Imf_3_4::globalThreadCount();
  Imf_3_4::TiledOutputFile::TiledOutputFile
            ((TiledOutputFile *)local_1b0,pcVar5,(Header *)local_b8,iVar1);
  Imf_3_4::TiledOutputFile::setFrameBuffer((FrameBuffer *)local_1b0);
  iVar1 = Imf_3_4::TiledOutputFile::numXTiles((int)local_1b0);
  iVar2 = Imf_3_4::TiledOutputFile::numYTiles((int)local_1b0);
  Imf_3_4::TiledOutputFile::writeTiles((int)local_1b0,0,iVar1 + -1,0,iVar2 + -1);
  Imf_3_4::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)local_1b0);
  Imf_3_4::FrameBuffer::~FrameBuffer((FrameBuffer *)0x216d2e);
  Imf_3_4::Header::~Header((Header *)local_b8);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),in_stack_fffffffffffff738
             ,(allocator<char> *)CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730));
  iVar1 = Imf_3_4::globalThreadCount();
  Imf_3_4::TiledRgbaInputFile::TiledRgbaInputFile
            ((TiledRgbaInputFile *)local_1e8,pcVar5,local_208,iVar1);
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator(&local_209);
  Imf_3_4::Array2D<Imf_3_4::Rgba>::Array2D
            ((Array2D<Imf_3_4::Rgba> *)CONCAT44(in_stack_fffffffffffff754,in_stack_fffffffffffff750)
             ,in_stack_fffffffffffff748,
             CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740));
  pRVar6 = Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_228,0);
  Imf_3_4::TiledRgbaInputFile::setFrameBuffer(local_1e8,(ulong)pRVar6,1);
  iVar1 = Imf_3_4::TiledRgbaInputFile::numXTiles((int)local_1e8);
  iVar2 = Imf_3_4::TiledRgbaInputFile::numYTiles((int)local_1e8);
  Imf_3_4::TiledRgbaInputFile::readTiles((int)local_1e8,0,iVar1 + -1,0,iVar2 + -1);
  local_22c = 0;
  do {
    if (0x76 < local_22c) {
      Imf_3_4::Array2D<Imf_3_4::Rgba>::~Array2D
                ((Array2D<Imf_3_4::Rgba> *)CONCAT44(in_stack_fffffffffffff704,uVar9));
      Imf_3_4::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)local_1e8);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
                 in_stack_fffffffffffff738,
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730));
      iVar1 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledRgbaInputFile::TiledRgbaInputFile
                ((TiledRgbaInputFile *)local_268,pcVar5,local_288,iVar1);
      std::__cxx11::string::~string(local_288);
      std::allocator<char>::~allocator(&local_289);
      Imf_3_4::Array2D<Imf_3_4::Rgba>::Array2D
                ((Array2D<Imf_3_4::Rgba> *)
                 CONCAT44(in_stack_fffffffffffff754,in_stack_fffffffffffff750),
                 in_stack_fffffffffffff748,
                 CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740));
      pRVar6 = Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_2a8,0);
      Imf_3_4::TiledRgbaInputFile::setFrameBuffer(local_268,(ulong)pRVar6,1);
      iVar1 = Imf_3_4::TiledRgbaInputFile::numXTiles((int)local_268);
      iVar2 = Imf_3_4::TiledRgbaInputFile::numYTiles((int)local_268);
      Imf_3_4::TiledRgbaInputFile::readTiles((int)local_268,0,iVar1 + -1,0,iVar2 + -1);
      local_2ac = 0;
      do {
        if (0x76 < local_2ac) {
          Imf_3_4::Array2D<Imf_3_4::Rgba>::~Array2D
                    ((Array2D<Imf_3_4::Rgba> *)CONCAT44(in_stack_fffffffffffff704,uVar9));
          Imf_3_4::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)local_268);
          pcVar5 = (char *)std::__cxx11::string::c_str();
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
                     in_stack_fffffffffffff738,
                     (allocator<char> *)
                     CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730));
          iVar1 = Imf_3_4::globalThreadCount();
          Imf_3_4::TiledRgbaInputFile::TiledRgbaInputFile
                    ((TiledRgbaInputFile *)local_2e8,pcVar5,local_308,iVar1);
          std::__cxx11::string::~string(local_308);
          std::allocator<char>::~allocator(&local_309);
          Imf_3_4::Array2D<Imf_3_4::Rgba>::Array2D
                    ((Array2D<Imf_3_4::Rgba> *)
                     CONCAT44(in_stack_fffffffffffff754,in_stack_fffffffffffff750),
                     in_stack_fffffffffffff748,
                     CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740));
          pRVar6 = Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_328,0);
          Imf_3_4::TiledRgbaInputFile::setFrameBuffer(local_2e8,(ulong)pRVar6,1);
          iVar1 = Imf_3_4::TiledRgbaInputFile::numXTiles((int)local_2e8);
          iVar2 = Imf_3_4::TiledRgbaInputFile::numYTiles((int)local_2e8);
          Imf_3_4::TiledRgbaInputFile::readTiles((int)local_2e8,0,iVar1 + -1,0,iVar2 / 2 + -1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
                     in_stack_fffffffffffff738,
                     (allocator<char> *)
                     CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730));
          Imf_3_4::TiledRgbaInputFile::setLayerName((string *)local_2e8);
          std::__cxx11::string::~string(local_348);
          std::allocator<char>::~allocator(&local_349);
          pRVar6 = Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_328,0);
          Imf_3_4::TiledRgbaInputFile::setFrameBuffer(local_2e8,(ulong)pRVar6,1);
          iVar1 = Imf_3_4::TiledRgbaInputFile::numXTiles((int)local_2e8);
          iVar2 = Imf_3_4::TiledRgbaInputFile::numYTiles((int)local_2e8);
          iVar3 = Imf_3_4::TiledRgbaInputFile::numYTiles((int)local_2e8);
          Imf_3_4::TiledRgbaInputFile::readTiles((int)local_2e8,0,iVar1 + -1,iVar2 / 2,iVar3 + -1);
          local_350 = 0;
          do {
            if (0x76 < local_350) {
              Imf_3_4::Array2D<Imf_3_4::Rgba>::~Array2D
                        ((Array2D<Imf_3_4::Rgba> *)CONCAT44(in_stack_fffffffffffff704,uVar9));
              Imf_3_4::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)local_2e8);
              Imath_3_2::Vec2<float>::Vec2(&local_398,0.0,0.0);
              Imf_3_4::Header::Header
                        ((Header *)local_390,0xed,0x77,1.0,(Vec2 *)&local_398,1.0,INCREASING_Y,
                         ZIP_COMPRESSION);
              Imf_3_4::TileDescription::TileDescription(&local_3a8,0x20,0x20,ONE_LEVEL,ROUND_DOWN);
              Imf_3_4::Header::setTileDescription(local_390);
              pcVar5 = (char *)Imf_3_4::Header::channels();
              Imf_3_4::Channel::Channel(local_3b8,HALF,1,1,false);
              Imf_3_4::ChannelList::insert(pcVar5,(Channel *)0x230c44);
              pcVar5 = (char *)Imf_3_4::Header::channels();
              Imf_3_4::Channel::Channel(local_3c8,HALF,1,1,false);
              Imf_3_4::ChannelList::insert(pcVar5,(Channel *)"foo.Y");
              Imf_3_4::FrameBuffer::FrameBuffer((FrameBuffer *)0x217d91);
              phVar4 = Imf_3_4::Array2D<Imath_3_2::half>::operator[](&local_48,0);
              Imf_3_4::Slice::Slice(local_430,HALF,(char *)phVar4,2,0x1da,1,1,0.0,false,false);
              Imf_3_4::FrameBuffer::insert(local_3f8,(Slice *)0x230c44);
              phVar4 = Imf_3_4::Array2D<Imath_3_2::half>::operator[](&local_70,0);
              uVar9 = 0;
              Imf_3_4::Slice::Slice
                        ((Slice *)(local_488 + 0x20),HALF,(char *)phVar4,2,0x1da,1,1,0.0,false,false
                        );
              Imf_3_4::FrameBuffer::insert(local_3f8,(Slice *)"foo.Y");
              pcVar5 = (char *)std::__cxx11::string::c_str();
              iVar1 = Imf_3_4::globalThreadCount();
              Imf_3_4::TiledOutputFile::TiledOutputFile
                        ((TiledOutputFile *)local_488,pcVar5,(Header *)local_390,iVar1);
              Imf_3_4::TiledOutputFile::setFrameBuffer((FrameBuffer *)local_488);
              iVar1 = Imf_3_4::TiledOutputFile::numXTiles((int)local_488);
              iVar2 = Imf_3_4::TiledOutputFile::numYTiles((int)local_488);
              Imf_3_4::TiledOutputFile::writeTiles((int)local_488,0,iVar1 + -1,0,iVar2 + -1);
              Imf_3_4::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)local_488);
              Imf_3_4::FrameBuffer::~FrameBuffer((FrameBuffer *)0x217f71);
              Imf_3_4::Header::~Header((Header *)local_390);
              pcVar5 = (char *)std::__cxx11::string::c_str();
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
                         in_stack_fffffffffffff738,
                         (allocator<char> *)
                         CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730));
              iVar1 = Imf_3_4::globalThreadCount();
              Imf_3_4::TiledRgbaInputFile::TiledRgbaInputFile
                        ((TiledRgbaInputFile *)local_4c0,pcVar5,local_4e0,iVar1);
              std::__cxx11::string::~string(local_4e0);
              std::allocator<char>::~allocator(&local_4e1);
              Imf_3_4::Array2D<Imf_3_4::Rgba>::Array2D
                        ((Array2D<Imf_3_4::Rgba> *)
                         CONCAT44(in_stack_fffffffffffff754,in_stack_fffffffffffff750),
                         in_stack_fffffffffffff748,
                         CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740));
              pRVar6 = Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_500,0);
              Imf_3_4::TiledRgbaInputFile::setFrameBuffer(local_4c0,(ulong)pRVar6,1);
              iVar1 = Imf_3_4::TiledRgbaInputFile::numXTiles((int)local_4c0);
              iVar2 = Imf_3_4::TiledRgbaInputFile::numYTiles((int)local_4c0);
              Imf_3_4::TiledRgbaInputFile::readTiles((int)local_4c0,0,iVar1 + -1,0,iVar2 + -1);
              local_504 = 0;
              do {
                if (0x76 < local_504) {
                  Imf_3_4::Array2D<Imf_3_4::Rgba>::~Array2D
                            ((Array2D<Imf_3_4::Rgba> *)CONCAT44(in_stack_fffffffffffff704,uVar9));
                  Imf_3_4::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)local_4c0);
                  pcVar5 = (char *)std::__cxx11::string::c_str();
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
                             in_stack_fffffffffffff738,
                             (allocator<char> *)
                             CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730));
                  iVar1 = Imf_3_4::globalThreadCount();
                  Imf_3_4::TiledRgbaInputFile::TiledRgbaInputFile
                            ((TiledRgbaInputFile *)local_540,pcVar5,local_560,iVar1);
                  std::__cxx11::string::~string(local_560);
                  std::allocator<char>::~allocator(&local_561);
                  Imf_3_4::Array2D<Imf_3_4::Rgba>::Array2D
                            ((Array2D<Imf_3_4::Rgba> *)
                             CONCAT44(in_stack_fffffffffffff754,in_stack_fffffffffffff750),
                             in_stack_fffffffffffff748,
                             CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740));
                  pRVar6 = Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_580,0);
                  Imf_3_4::TiledRgbaInputFile::setFrameBuffer(local_540,(ulong)pRVar6,1);
                  iVar1 = Imf_3_4::TiledRgbaInputFile::numXTiles((int)local_540);
                  iVar2 = Imf_3_4::TiledRgbaInputFile::numYTiles((int)local_540);
                  Imf_3_4::TiledRgbaInputFile::readTiles((int)local_540,0,iVar1 + -1,0,iVar2 + -1);
                  local_584 = 0;
                  do {
                    if (0x76 < local_584) {
                      Imf_3_4::Array2D<Imf_3_4::Rgba>::~Array2D
                                ((Array2D<Imf_3_4::Rgba> *)CONCAT44(in_stack_fffffffffffff704,uVar9)
                                );
                      Imf_3_4::TiledRgbaInputFile::~TiledRgbaInputFile
                                ((TiledRgbaInputFile *)local_540);
                      pcVar5 = (char *)std::__cxx11::string::c_str();
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
                                 in_stack_fffffffffffff738,
                                 (allocator<char> *)
                                 CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730));
                      iVar1 = Imf_3_4::globalThreadCount();
                      Imf_3_4::TiledRgbaInputFile::TiledRgbaInputFile
                                ((TiledRgbaInputFile *)local_5c0,pcVar5,local_5e0,iVar1);
                      std::__cxx11::string::~string(local_5e0);
                      std::allocator<char>::~allocator(&local_5e1);
                      Imf_3_4::Array2D<Imf_3_4::Rgba>::Array2D
                                ((Array2D<Imf_3_4::Rgba> *)
                                 CONCAT44(in_stack_fffffffffffff754,in_stack_fffffffffffff750),
                                 in_stack_fffffffffffff748,
                                 CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740));
                      pRVar6 = Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_600,0);
                      Imf_3_4::TiledRgbaInputFile::setFrameBuffer(local_5c0,(ulong)pRVar6,1);
                      iVar1 = Imf_3_4::TiledRgbaInputFile::numXTiles((int)local_5c0);
                      iVar2 = Imf_3_4::TiledRgbaInputFile::numYTiles((int)local_5c0);
                      Imf_3_4::TiledRgbaInputFile::readTiles
                                ((int)local_5c0,0,iVar1 + -1,0,iVar2 / 2 + -1);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
                                 in_stack_fffffffffffff738,
                                 (allocator<char> *)
                                 CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730));
                      Imf_3_4::TiledRgbaInputFile::setLayerName((string *)local_5c0);
                      std::__cxx11::string::~string(local_620);
                      std::allocator<char>::~allocator(&local_621);
                      pRVar6 = Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_600,0);
                      Imf_3_4::TiledRgbaInputFile::setFrameBuffer(local_5c0,(ulong)pRVar6,1);
                      iVar1 = Imf_3_4::TiledRgbaInputFile::numXTiles((int)local_5c0);
                      iVar2 = Imf_3_4::TiledRgbaInputFile::numYTiles((int)local_5c0);
                      iVar3 = Imf_3_4::TiledRgbaInputFile::numYTiles((int)local_5c0);
                      Imf_3_4::TiledRgbaInputFile::readTiles
                                ((int)local_5c0,0,iVar1 + -1,iVar2 / 2,iVar3 + -1);
                      local_628 = 0;
                      do {
                        if (0x76 < local_628) {
                          Imf_3_4::Array2D<Imf_3_4::Rgba>::~Array2D
                                    ((Array2D<Imf_3_4::Rgba> *)
                                     CONCAT44(in_stack_fffffffffffff704,uVar9));
                          Imf_3_4::TiledRgbaInputFile::~TiledRgbaInputFile
                                    ((TiledRgbaInputFile *)local_5c0);
                          pcVar5 = (char *)std::__cxx11::string::c_str();
                          remove(pcVar5);
                          Imf_3_4::Array2D<Imath_3_2::half>::~Array2D
                                    ((Array2D<Imath_3_2::half> *)
                                     CONCAT44(in_stack_fffffffffffff704,uVar9));
                          Imf_3_4::Array2D<Imath_3_2::half>::~Array2D
                                    ((Array2D<Imath_3_2::half> *)
                                     CONCAT44(in_stack_fffffffffffff704,uVar9));
                          std::__cxx11::string::~string(local_28);
                          return;
                        }
                        for (local_62c = 0; local_62c < 0xed; local_62c = local_62c + 1) {
                          iVar1 = Imf_3_4::TiledRgbaInputFile::numYTiles((int)local_5c0);
                          iVar2 = Imf_3_4::TiledRgbaInputFile::tileYSize();
                          if (local_628 < (iVar1 / 2) * iVar2) {
                            Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_600,(long)local_628);
                            fVar7 = Imath_3_2::half::operator_cast_to_float
                                              ((half *)CONCAT44(in_stack_fffffffffffff704,uVar9));
                            Imf_3_4::Array2D<Imath_3_2::half>::operator[](&local_48,(long)local_628)
                            ;
                            fVar8 = Imath_3_2::half::operator_cast_to_float
                                              ((half *)CONCAT44(in_stack_fffffffffffff704,uVar9));
                            if ((fVar7 != fVar8) || (NAN(fVar7) || NAN(fVar8))) {
                              __assert_fail("p3[y][x].r == p1[y][x]",
                                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                            ,0x35f,
                                            "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                           );
                            }
                            Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_600,(long)local_628);
                            fVar7 = Imath_3_2::half::operator_cast_to_float
                                              ((half *)CONCAT44(in_stack_fffffffffffff704,uVar9));
                            Imf_3_4::Array2D<Imath_3_2::half>::operator[](&local_48,(long)local_628)
                            ;
                            fVar8 = Imath_3_2::half::operator_cast_to_float
                                              ((half *)CONCAT44(in_stack_fffffffffffff704,uVar9));
                            if ((fVar7 != fVar8) || (NAN(fVar7) || NAN(fVar8))) {
                              __assert_fail("p3[y][x].g == p1[y][x]",
                                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                            ,0x360,
                                            "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                           );
                            }
                            Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_600,(long)local_628);
                            fVar7 = Imath_3_2::half::operator_cast_to_float
                                              ((half *)CONCAT44(in_stack_fffffffffffff704,uVar9));
                            Imf_3_4::Array2D<Imath_3_2::half>::operator[](&local_48,(long)local_628)
                            ;
                            fVar8 = Imath_3_2::half::operator_cast_to_float
                                              ((half *)CONCAT44(in_stack_fffffffffffff704,uVar9));
                            if ((fVar7 != fVar8) || (NAN(fVar7) || NAN(fVar8))) {
                              __assert_fail("p3[y][x].b == p1[y][x]",
                                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                            ,0x361,
                                            "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                           );
                            }
                          }
                          else {
                            Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_600,(long)local_628);
                            fVar7 = Imath_3_2::half::operator_cast_to_float
                                              ((half *)CONCAT44(in_stack_fffffffffffff704,uVar9));
                            Imf_3_4::Array2D<Imath_3_2::half>::operator[](&local_70,(long)local_628)
                            ;
                            fVar8 = Imath_3_2::half::operator_cast_to_float
                                              ((half *)CONCAT44(in_stack_fffffffffffff704,uVar9));
                            if ((fVar7 != fVar8) || (NAN(fVar7) || NAN(fVar8))) {
                              __assert_fail("p3[y][x].r == p2[y][x]",
                                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                            ,0x365,
                                            "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                           );
                            }
                            Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_600,(long)local_628);
                            fVar7 = Imath_3_2::half::operator_cast_to_float
                                              ((half *)CONCAT44(in_stack_fffffffffffff704,uVar9));
                            Imf_3_4::Array2D<Imath_3_2::half>::operator[](&local_70,(long)local_628)
                            ;
                            fVar8 = Imath_3_2::half::operator_cast_to_float
                                              ((half *)CONCAT44(in_stack_fffffffffffff704,uVar9));
                            if ((fVar7 != fVar8) || (NAN(fVar7) || NAN(fVar8))) {
                              __assert_fail("p3[y][x].g == p2[y][x]",
                                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                            ,0x366,
                                            "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                           );
                            }
                            Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_600,(long)local_628);
                            fVar7 = Imath_3_2::half::operator_cast_to_float
                                              ((half *)CONCAT44(in_stack_fffffffffffff704,uVar9));
                            Imf_3_4::Array2D<Imath_3_2::half>::operator[](&local_70,(long)local_628)
                            ;
                            fVar8 = Imath_3_2::half::operator_cast_to_float
                                              ((half *)CONCAT44(in_stack_fffffffffffff704,uVar9));
                            if ((fVar7 != fVar8) || (NAN(fVar7) || NAN(fVar8))) {
                              __assert_fail("p3[y][x].b == p2[y][x]",
                                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                            ,0x367,
                                            "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                           );
                            }
                          }
                          Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_600,(long)local_628);
                          fVar7 = Imath_3_2::half::operator_cast_to_float
                                            ((half *)CONCAT44(in_stack_fffffffffffff704,uVar9));
                          if ((fVar7 != 1.0) || (NAN(fVar7))) {
                            __assert_fail("p3[y][x].a == 1",
                                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                          ,0x36a,
                                          "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                         );
                          }
                        }
                        local_628 = local_628 + 1;
                      } while( true );
                    }
                    for (local_588 = 0; local_588 < 0xed; local_588 = local_588 + 1) {
                      Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_580,(long)local_584);
                      fVar7 = Imath_3_2::half::operator_cast_to_float
                                        ((half *)CONCAT44(in_stack_fffffffffffff704,uVar9));
                      Imf_3_4::Array2D<Imath_3_2::half>::operator[](&local_70,(long)local_584);
                      fVar8 = Imath_3_2::half::operator_cast_to_float
                                        ((half *)CONCAT44(in_stack_fffffffffffff704,uVar9));
                      if ((fVar7 != fVar8) || (NAN(fVar7) || NAN(fVar8))) {
                        __assert_fail("p3[y][x].r == p2[y][x]",
                                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                      ,0x340,
                                      "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                     );
                      }
                      Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_580,(long)local_584);
                      fVar7 = Imath_3_2::half::operator_cast_to_float
                                        ((half *)CONCAT44(in_stack_fffffffffffff704,uVar9));
                      Imf_3_4::Array2D<Imath_3_2::half>::operator[](&local_70,(long)local_584);
                      fVar8 = Imath_3_2::half::operator_cast_to_float
                                        ((half *)CONCAT44(in_stack_fffffffffffff704,uVar9));
                      if ((fVar7 != fVar8) || (NAN(fVar7) || NAN(fVar8))) {
                        __assert_fail("p3[y][x].g == p2[y][x]",
                                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                      ,0x341,
                                      "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                     );
                      }
                      Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_580,(long)local_584);
                      fVar7 = Imath_3_2::half::operator_cast_to_float
                                        ((half *)CONCAT44(in_stack_fffffffffffff704,uVar9));
                      Imf_3_4::Array2D<Imath_3_2::half>::operator[](&local_70,(long)local_584);
                      fVar8 = Imath_3_2::half::operator_cast_to_float
                                        ((half *)CONCAT44(in_stack_fffffffffffff704,uVar9));
                      if ((fVar7 != fVar8) || (NAN(fVar7) || NAN(fVar8))) {
                        __assert_fail("p3[y][x].b == p2[y][x]",
                                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                      ,0x342,
                                      "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                     );
                      }
                      Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_580,(long)local_584);
                      fVar7 = Imath_3_2::half::operator_cast_to_float
                                        ((half *)CONCAT44(in_stack_fffffffffffff704,uVar9));
                      if ((fVar7 != 1.0) || (NAN(fVar7))) {
                        __assert_fail("p3[y][x].a == 1",
                                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                      ,0x343,
                                      "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                     );
                      }
                    }
                    local_584 = local_584 + 1;
                  } while( true );
                }
                for (local_508 = 0; local_508 < 0xed; local_508 = local_508 + 1) {
                  Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_500,(long)local_504);
                  fVar7 = Imath_3_2::half::operator_cast_to_float
                                    ((half *)CONCAT44(in_stack_fffffffffffff704,uVar9));
                  Imf_3_4::Array2D<Imath_3_2::half>::operator[](&local_48,(long)local_504);
                  fVar8 = Imath_3_2::half::operator_cast_to_float
                                    ((half *)CONCAT44(in_stack_fffffffffffff704,uVar9));
                  if ((fVar7 != fVar8) || (NAN(fVar7) || NAN(fVar8))) {
                    __assert_fail("p3[y][x].r == p1[y][x]",
                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                  ,0x32d,
                                  "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                 );
                  }
                  Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_500,(long)local_504);
                  fVar7 = Imath_3_2::half::operator_cast_to_float
                                    ((half *)CONCAT44(in_stack_fffffffffffff704,uVar9));
                  Imf_3_4::Array2D<Imath_3_2::half>::operator[](&local_48,(long)local_504);
                  fVar8 = Imath_3_2::half::operator_cast_to_float
                                    ((half *)CONCAT44(in_stack_fffffffffffff704,uVar9));
                  if ((fVar7 != fVar8) || (NAN(fVar7) || NAN(fVar8))) {
                    __assert_fail("p3[y][x].g == p1[y][x]",
                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                  ,0x32e,
                                  "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                 );
                  }
                  Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_500,(long)local_504);
                  fVar7 = Imath_3_2::half::operator_cast_to_float
                                    ((half *)CONCAT44(in_stack_fffffffffffff704,uVar9));
                  Imf_3_4::Array2D<Imath_3_2::half>::operator[](&local_48,(long)local_504);
                  fVar8 = Imath_3_2::half::operator_cast_to_float
                                    ((half *)CONCAT44(in_stack_fffffffffffff704,uVar9));
                  if ((fVar7 != fVar8) || (NAN(fVar7) || NAN(fVar8))) {
                    __assert_fail("p3[y][x].b == p1[y][x]",
                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                  ,0x32f,
                                  "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                 );
                  }
                  Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_500,(long)local_504);
                  fVar7 = Imath_3_2::half::operator_cast_to_float
                                    ((half *)CONCAT44(in_stack_fffffffffffff704,uVar9));
                  if ((fVar7 != 1.0) || (NAN(fVar7))) {
                    __assert_fail("p3[y][x].a == 1",
                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                  ,0x330,
                                  "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                 );
                  }
                }
                local_504 = local_504 + 1;
              } while( true );
            }
            for (local_354 = 0; iVar1 = local_350, local_354 < 0xed; local_354 = local_354 + 1) {
              iVar2 = Imf_3_4::TiledRgbaInputFile::numYTiles((int)local_2e8);
              iVar3 = Imf_3_4::TiledRgbaInputFile::tileYSize();
              if (iVar1 < (iVar2 / 2) * iVar3) {
                Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_328,(long)local_350);
                fVar7 = Imath_3_2::half::operator_cast_to_float
                                  ((half *)CONCAT44(in_stack_fffffffffffff704,uVar9));
                Imf_3_4::Array2D<Imath_3_2::half>::operator[](&local_48,(long)local_350);
                fVar8 = Imath_3_2::half::operator_cast_to_float
                                  ((half *)CONCAT44(in_stack_fffffffffffff704,uVar9));
                if ((fVar7 != fVar8) || (NAN(fVar7) || NAN(fVar8))) {
                  __assert_fail("p3[y][x].r == p1[y][x]",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                ,0x2fa,
                                "void (anonymous namespace)::writeReadLayers(const std::string &)");
                }
              }
              else {
                Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_328,(long)local_350);
                fVar7 = Imath_3_2::half::operator_cast_to_float
                                  ((half *)CONCAT44(in_stack_fffffffffffff704,uVar9));
                Imf_3_4::Array2D<Imath_3_2::half>::operator[](&local_70,(long)local_350);
                fVar8 = Imath_3_2::half::operator_cast_to_float
                                  ((half *)CONCAT44(in_stack_fffffffffffff704,uVar9));
                if ((fVar7 != fVar8) || (NAN(fVar7) || NAN(fVar8))) {
                  __assert_fail("p3[y][x].r == p2[y][x]",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                ,0x2fc,
                                "void (anonymous namespace)::writeReadLayers(const std::string &)");
                }
              }
              Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_328,(long)local_350);
              fVar7 = Imath_3_2::half::operator_cast_to_float
                                ((half *)CONCAT44(in_stack_fffffffffffff704,uVar9));
              if ((fVar7 != 0.0) || (NAN(fVar7))) {
                __assert_fail("p3[y][x].g == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                              ,0x2fe,
                              "void (anonymous namespace)::writeReadLayers(const std::string &)");
              }
              Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_328,(long)local_350);
              fVar7 = Imath_3_2::half::operator_cast_to_float
                                ((half *)CONCAT44(in_stack_fffffffffffff704,uVar9));
              if ((fVar7 != 0.0) || (NAN(fVar7))) {
                __assert_fail("p3[y][x].b == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                              ,0x2ff,
                              "void (anonymous namespace)::writeReadLayers(const std::string &)");
              }
              Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_328,(long)local_350);
              fVar7 = Imath_3_2::half::operator_cast_to_float
                                ((half *)CONCAT44(in_stack_fffffffffffff704,uVar9));
              if ((fVar7 != 1.0) || (NAN(fVar7))) {
                __assert_fail("p3[y][x].a == 1",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                              ,0x300,
                              "void (anonymous namespace)::writeReadLayers(const std::string &)");
              }
            }
            local_350 = local_350 + 1;
          } while( true );
        }
        for (local_2b0 = 0; local_2b0 < 0xed; local_2b0 = local_2b0 + 1) {
          Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_2a8,(long)local_2ac);
          fVar7 = Imath_3_2::half::operator_cast_to_float
                            ((half *)CONCAT44(in_stack_fffffffffffff704,uVar9));
          Imf_3_4::Array2D<Imath_3_2::half>::operator[](&local_70,(long)local_2ac);
          fVar8 = Imath_3_2::half::operator_cast_to_float
                            ((half *)CONCAT44(in_stack_fffffffffffff704,uVar9));
          if ((fVar7 != fVar8) || (NAN(fVar7) || NAN(fVar8))) {
            __assert_fail("p3[y][x].r == p2[y][x]",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                          ,0x2dc,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_2a8,(long)local_2ac);
          fVar7 = Imath_3_2::half::operator_cast_to_float
                            ((half *)CONCAT44(in_stack_fffffffffffff704,uVar9));
          if ((fVar7 != 0.0) || (NAN(fVar7))) {
            __assert_fail("p3[y][x].g == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                          ,0x2dd,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_2a8,(long)local_2ac);
          fVar7 = Imath_3_2::half::operator_cast_to_float
                            ((half *)CONCAT44(in_stack_fffffffffffff704,uVar9));
          if ((fVar7 != 0.0) || (NAN(fVar7))) {
            __assert_fail("p3[y][x].b == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                          ,0x2de,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_2a8,(long)local_2ac);
          fVar7 = Imath_3_2::half::operator_cast_to_float
                            ((half *)CONCAT44(in_stack_fffffffffffff704,uVar9));
          if ((fVar7 != 1.0) || (NAN(fVar7))) {
            __assert_fail("p3[y][x].a == 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                          ,0x2df,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
        }
        local_2ac = local_2ac + 1;
      } while( true );
    }
    for (local_230 = 0; local_230 < 0xed; local_230 = local_230 + 1) {
      Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_228,(long)local_22c);
      fVar7 = Imath_3_2::half::operator_cast_to_float
                        ((half *)CONCAT44(in_stack_fffffffffffff704,uVar9));
      Imf_3_4::Array2D<Imath_3_2::half>::operator[](&local_48,(long)local_22c);
      fVar8 = Imath_3_2::half::operator_cast_to_float
                        ((half *)CONCAT44(in_stack_fffffffffffff704,uVar9));
      if ((fVar7 != fVar8) || (NAN(fVar7) || NAN(fVar8))) {
        __assert_fail("p3[y][x].r == p1[y][x]",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                      ,0x2c9,"void (anonymous namespace)::writeReadLayers(const std::string &)");
      }
      Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_228,(long)local_22c);
      fVar7 = Imath_3_2::half::operator_cast_to_float
                        ((half *)CONCAT44(in_stack_fffffffffffff704,uVar9));
      if ((fVar7 != 0.0) || (NAN(fVar7))) {
        __assert_fail("p3[y][x].g == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                      ,0x2ca,"void (anonymous namespace)::writeReadLayers(const std::string &)");
      }
      Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_228,(long)local_22c);
      fVar7 = Imath_3_2::half::operator_cast_to_float
                        ((half *)CONCAT44(in_stack_fffffffffffff704,uVar9));
      if ((fVar7 != 0.0) || (NAN(fVar7))) {
        __assert_fail("p3[y][x].b == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                      ,0x2cb,"void (anonymous namespace)::writeReadLayers(const std::string &)");
      }
      Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_228,(long)local_22c);
      fVar7 = Imath_3_2::half::operator_cast_to_float
                        ((half *)CONCAT44(in_stack_fffffffffffff704,uVar9));
      if ((fVar7 != 1.0) || (NAN(fVar7))) {
        __assert_fail("p3[y][x].a == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                      ,0x2cc,"void (anonymous namespace)::writeReadLayers(const std::string &)");
      }
    }
    local_22c = local_22c + 1;
  } while( true );
}

Assistant:

void
writeReadLayers (const std::string& tempDir)
{
    cout << "\nreading multi-layer file" << endl;

    std::string fileName = tempDir + "imf_test_tiled_multi_layer_rgba.exr";

    const int W = 237;
    const int H = 119;

    Array2D<half> p1 (H, W);
    Array2D<half> p2 (H, W);

    for (int y = 0; y < H; ++y)
    {
        for (int x = 0; x < W; ++x)
        {
            p1[y][x] = half (y % 23 + x % 17);
            p2[y][x] = half (y % 29 + x % 19);
        }
    }

    {
        Header hdr (W, H);
        hdr.setTileDescription (TileDescription ());
        hdr.channels ().insert ("R", Channel (HALF));
        hdr.channels ().insert ("foo.R", Channel (HALF));

        FrameBuffer fb;

        fb.insert (
            "R",
            Slice (
                HALF,                // type
                (char*) &p1[0][0],   // base
                sizeof (half),       // xStride
                sizeof (half) * W)); // yStride

        fb.insert (
            "foo.R",
            Slice (
                HALF,                // type
                (char*) &p2[0][0],   // base
                sizeof (half),       // xStride
                sizeof (half) * W)); // yStride

        TiledOutputFile out (fileName.c_str (), hdr);
        out.setFrameBuffer (fb);
        out.writeTiles (0, out.numXTiles () - 1, 0, out.numYTiles () - 1);
    }

    {
        TiledRgbaInputFile in (fileName.c_str (), "");

        Array2D<Rgba> p3 (H, W);
        in.setFrameBuffer (&p3[0][0], 1, W);
        in.readTiles (0, in.numXTiles () - 1, 0, in.numYTiles () - 1);

        for (int y = 0; y < H; ++y)
        {
            for (int x = 0; x < W; ++x)
            {
                assert (p3[y][x].r == p1[y][x]);
                assert (p3[y][x].g == 0);
                assert (p3[y][x].b == 0);
                assert (p3[y][x].a == 1);
            }
        }
    }

    {
        TiledRgbaInputFile in (fileName.c_str (), "foo");

        Array2D<Rgba> p3 (H, W);
        in.setFrameBuffer (&p3[0][0], 1, W);
        in.readTiles (0, in.numXTiles () - 1, 0, in.numYTiles () - 1);

        for (int y = 0; y < H; ++y)
        {
            for (int x = 0; x < W; ++x)
            {
                assert (p3[y][x].r == p2[y][x]);
                assert (p3[y][x].g == 0);
                assert (p3[y][x].b == 0);
                assert (p3[y][x].a == 1);
            }
        }
    }

    {
        TiledRgbaInputFile in (fileName.c_str (), "");

        Array2D<Rgba> p3 (H, W);

        in.setFrameBuffer (&p3[0][0], 1, W);

        in.readTiles (0, in.numXTiles () - 1, 0, in.numYTiles () / 2 - 1);

        in.setLayerName ("foo");

        in.setFrameBuffer (&p3[0][0], 1, W);

        in.readTiles (
            0, in.numXTiles () - 1, in.numYTiles () / 2, in.numYTiles () - 1);

        for (int y = 0; y < H; ++y)
        {
            for (int x = 0; x < W; ++x)
            {
                if (y <
                    static_cast<int> ((in.numYTiles () / 2) * in.tileYSize ()))
                    assert (p3[y][x].r == p1[y][x]);
                else
                    assert (p3[y][x].r == p2[y][x]);

                assert (p3[y][x].g == 0);
                assert (p3[y][x].b == 0);
                assert (p3[y][x].a == 1);
            }
        }
    }

    {
        Header hdr (W, H);
        hdr.setTileDescription (TileDescription ());
        hdr.channels ().insert ("Y", Channel (HALF));
        hdr.channels ().insert ("foo.Y", Channel (HALF));

        FrameBuffer fb;

        fb.insert (
            "Y",
            Slice (
                HALF,                // type
                (char*) &p1[0][0],   // base
                sizeof (half),       // xStride
                sizeof (half) * W)); // yStride

        fb.insert (
            "foo.Y",
            Slice (
                HALF,                // type
                (char*) &p2[0][0],   // base
                sizeof (half),       // xStride
                sizeof (half) * W)); // yStride

        TiledOutputFile out (fileName.c_str (), hdr);
        out.setFrameBuffer (fb);
        out.writeTiles (0, out.numXTiles () - 1, 0, out.numYTiles () - 1);
    }

    {
        TiledRgbaInputFile in (fileName.c_str (), "");

        Array2D<Rgba> p3 (H, W);
        in.setFrameBuffer (&p3[0][0], 1, W);
        in.readTiles (0, in.numXTiles () - 1, 0, in.numYTiles () - 1);

        for (int y = 0; y < H; ++y)
        {
            for (int x = 0; x < W; ++x)
            {
                assert (p3[y][x].r == p1[y][x]);
                assert (p3[y][x].g == p1[y][x]);
                assert (p3[y][x].b == p1[y][x]);
                assert (p3[y][x].a == 1);
            }
        }
    }

    {
        TiledRgbaInputFile in (fileName.c_str (), "foo");

        Array2D<Rgba> p3 (H, W);
        in.setFrameBuffer (&p3[0][0], 1, W);
        in.readTiles (0, in.numXTiles () - 1, 0, in.numYTiles () - 1);

        for (int y = 0; y < H; ++y)
        {
            for (int x = 0; x < W; ++x)
            {
                assert (p3[y][x].r == p2[y][x]);
                assert (p3[y][x].g == p2[y][x]);
                assert (p3[y][x].b == p2[y][x]);
                assert (p3[y][x].a == 1);
            }
        }
    }

    {
        TiledRgbaInputFile in (fileName.c_str (), "");

        Array2D<Rgba> p3 (H, W);

        in.setFrameBuffer (&p3[0][0], 1, W);

        in.readTiles (0, in.numXTiles () - 1, 0, in.numYTiles () / 2 - 1);

        in.setLayerName ("foo");

        in.setFrameBuffer (&p3[0][0], 1, W);

        in.readTiles (
            0, in.numXTiles () - 1, in.numYTiles () / 2, in.numYTiles () - 1);

        for (int y = 0; y < H; ++y)
        {
            for (int x = 0; x < W; ++x)
            {
                if (y <
                    static_cast<int> ((in.numYTiles () / 2) * in.tileYSize ()))
                {
                    assert (p3[y][x].r == p1[y][x]);
                    assert (p3[y][x].g == p1[y][x]);
                    assert (p3[y][x].b == p1[y][x]);
                }
                else
                {
                    assert (p3[y][x].r == p2[y][x]);
                    assert (p3[y][x].g == p2[y][x]);
                    assert (p3[y][x].b == p2[y][x]);
                }

                assert (p3[y][x].a == 1);
            }
        }
    }

    remove (fileName.c_str ());
}